

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * GetFunctionUpvalue(ExpressionContext *ctx,SynBase *source,VariableData *target)

{
  uint uVar1;
  uint uniqueId;
  Allocator *allocator;
  ScopeData *pSVar2;
  int iVar3;
  uint offset;
  VariableData **ppVVar4;
  undefined4 extraout_var;
  TypeRef *type;
  VariableData *pVVar5;
  SynIdentifier *name;
  undefined4 extraout_var_02;
  char *__function;
  TypeBase *type_00;
  VariableData *variable;
  InplaceStr upvalueName;
  ExprVariableAccess *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  upvalueName = GetFunctionVariableUpvalueName(ctx,target);
  ppVVar4 = SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::find
                      (&ctx->upvalueMap,&upvalueName);
  if (ppVVar4 != (VariableData **)0x0) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    this = (ExprVariableAccess *)CONCAT44(extraout_var,iVar3);
    type_00 = (*ppVVar4)->type;
    pVVar5 = *ppVVar4;
LAB_001e131f:
    ExprVariableAccess::ExprVariableAccess(this,source,type_00,pVVar5);
    return &this->super_ExprBase;
  }
  type = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
  offset = anon_unknown.dwarf_1117a3::AllocateGlobalVariable
                     (ctx,source,(type->super_TypeBase).alignment,(type->super_TypeBase).size);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  pVVar5 = (VariableData *)CONCAT44(extraout_var_00,iVar3);
  allocator = ctx->allocator;
  pSVar2 = ctx->globalScope;
  uVar1 = (type->super_TypeBase).alignment;
  iVar3 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var_01,iVar3);
  (name->super_SynBase).typeID = 4;
  (name->super_SynBase).begin = (Lexeme *)0x0;
  (name->super_SynBase).end = (Lexeme *)0x0;
  (name->super_SynBase).pos.begin = (char *)0x0;
  (name->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
  (name->name).begin = upvalueName.begin;
  (name->name).end = upvalueName.end;
  uniqueId = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uniqueId + 1;
  VariableData::VariableData
            (pVVar5,allocator,source,pSVar2,uVar1,&type->super_TypeBase,name,offset,uniqueId);
  pSVar2 = ctx->globalScope;
  uVar1 = (pSVar2->variables).count;
  variable = pVVar5;
  if (uVar1 == (pSVar2->variables).max) {
    SmallArray<VariableData_*,_4U>::grow(&pSVar2->variables,uVar1);
  }
  ppVVar4 = (pSVar2->variables).data;
  if (ppVVar4 != (VariableData **)0x0) {
    uVar1 = (pSVar2->variables).count;
    (pSVar2->variables).count = uVar1 + 1;
    ppVVar4[uVar1] = pVVar5;
    pSVar2 = ctx->globalScope;
    uVar1 = (pSVar2->allVariables).count;
    if (uVar1 == (pSVar2->allVariables).max) {
      SmallArray<VariableData_*,_4U>::grow(&pSVar2->allVariables,uVar1);
    }
    ppVVar4 = (pSVar2->allVariables).data;
    if (ppVVar4 != (VariableData **)0x0) {
      uVar1 = (pSVar2->allVariables).count;
      (pSVar2->allVariables).count = uVar1 + 1;
      ppVVar4[uVar1] = pVVar5;
      uVar1 = (ctx->variables).count;
      if (uVar1 == (ctx->variables).max) {
        SmallArray<VariableData_*,_128U>::grow(&ctx->variables,uVar1);
      }
      ppVVar4 = (ctx->variables).data;
      if (ppVVar4 != (VariableData **)0x0) {
        uVar1 = (ctx->variables).count;
        (ctx->variables).count = uVar1 + 1;
        ppVVar4[uVar1] = pVVar5;
        uVar1 = (ctx->upvalues).count;
        if (uVar1 == (ctx->upvalues).max) {
          SmallArray<VariableData_*,_128U>::grow(&ctx->upvalues,uVar1);
        }
        ppVVar4 = (ctx->upvalues).data;
        if (ppVVar4 != (VariableData **)0x0) {
          uVar1 = (ctx->upvalues).count;
          (ctx->upvalues).count = uVar1 + 1;
          ppVVar4[uVar1] = pVVar5;
          SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
                    (&ctx->upvalueMap,&upvalueName,&variable);
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          this = (ExprVariableAccess *)CONCAT44(extraout_var_02,iVar3);
          type_00 = variable->type;
          pVVar5 = variable;
          goto LAB_001e131f;
        }
      }
      __function = 
      "void SmallArray<VariableData *, 128>::push_back(const T &) [T = VariableData *, N = 128]";
      goto LAB_001e1362;
    }
  }
  __function = 
  "void SmallArray<VariableData *, 4>::push_back(const T &) [T = VariableData *, N = 4]";
LAB_001e1362:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

ExprBase* GetFunctionUpvalue(ExpressionContext &ctx, SynBase *source, VariableData *target)
{
	InplaceStr upvalueName = GetFunctionVariableUpvalueName(ctx, target);

	if(VariableData **variable = ctx.upvalueMap.find(upvalueName))
	{
		return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, (*variable)->type, *variable);
	}

	TypeBase *type = ctx.GetReferenceType(ctx.typeVoid);

	unsigned offset = AllocateGlobalVariable(ctx, source, type->alignment, type->size);
	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.globalScope, type->alignment, type, new (ctx.get<SynIdentifier>()) SynIdentifier(upvalueName), offset, ctx.uniqueVariableId++);

	ctx.globalScope->variables.push_back(variable);
	ctx.globalScope->allVariables.push_back(variable);

	ctx.variables.push_back(variable);

	ctx.upvalues.push_back(variable);
	ctx.upvalueMap.insert(upvalueName, variable);

	return new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, variable->type, variable);
}